

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

Model * __thiscall Clasp::ClaspFacade::Summary::model(Summary *this)

{
  SolveData *pSVar1;
  SolveData *in_RDI;
  undefined8 local_18;
  
  pSVar1 = SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x125202
                     );
  if (pSVar1 == (SolveData *)0x0) {
    local_18 = (Model *)0x0;
  }
  else {
    SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x12521c);
    local_18 = SolveData::lastModel(in_RDI);
  }
  return local_18;
}

Assistant:

const Model* ClaspFacade::Summary::model() const { return facade->solve_.get() ? facade->solve_->lastModel() : 0; }